

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * adios2sys::SystemTools::GetRealPath(string *path,string *errorMessage)

{
  string *in_RDI;
  string *ret;
  string *in_stack_00000fc0;
  string *in_stack_00000fc8;
  string *in_stack_00000fd0;
  
  std::__cxx11::string::string((string *)in_RDI);
  Realpath(in_stack_00000fd0,in_stack_00000fc8,in_stack_00000fc0);
  return in_RDI;
}

Assistant:

std::string SystemTools::GetRealPath(const std::string& path,
                                     std::string* errorMessage)
{
  std::string ret;
  Realpath(path, ret, errorMessage);
  return ret;
}